

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy.h
# Opt level: O3

Contents __thiscall
snmalloc::
Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_21UL>
::add_block(Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_21UL>
            *this,Contents addr,size_t size)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  while (bVar2 = remove_buddy(this,addr,size), bVar2) {
    sVar1 = size * 2;
    addr = addr & size * -2;
    size = sVar1;
    if (sVar1 == 0x200000) {
      return addr;
    }
  }
  uVar4 = 0x3f;
  if (size - 1 != 0) {
    for (; size - 1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  lVar5 = -0xe;
  if (size != 1) {
    lVar5 = (uVar4 ^ 0xffffffffffffffc0) + 0x33;
  }
  uVar4 = lVar5 + 1U;
  if (lVar5 + 1U < this->empty_at_or_above) {
    uVar4 = this->empty_at_or_above;
  }
  this->empty_at_or_above = uVar4;
  lVar3 = 0;
  do {
    if (*(long *)((long)(this->entries)._M_elems[lVar5].cache + lVar3) == 0) {
      *(Contents *)((long)(this->entries)._M_elems[lVar5].cache + lVar3) = addr;
      return 0;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>>,14ul,21ul>
  ::add_block();
  return 0;
}

Assistant:

typename Rep::Contents add_block(typename Rep::Contents addr, size_t size)
    {
      validate_block(addr, size);

      if (remove_buddy(addr, size))
      {
        // Add to next level cache
        size *= 2;
        addr = Rep::align_down(addr, size);
        if (size == bits::one_at_bit(MAX_SIZE_BITS))
        {
          // Invariant should be checked on all non-tail return paths.
          // Holds trivially here with current design.
          invariant();
          // Too big for this buddy allocator.
          return addr;
        }
        return add_block(addr, size);
      }

      auto idx = to_index(size);
      empty_at_or_above = bits::max(empty_at_or_above, idx + 1);

      for (auto& e : entries[idx].cache)
      {
        if (Rep::equal(Rep::null, e))
        {
          e = addr;
          return Rep::null;
        }
      }

      auto path = entries[idx].tree.get_root_path();
      entries[idx].tree.find(path, addr);
      entries[idx].tree.insert_path(path, addr);
      invariant();
      return Rep::null;
    }